

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O1

void __thiscall
Js::BufferBuilderOf<short,_true>::Write
          (BufferBuilderOf<short,_true> *this,byte *buffer,uint32 bufferSize)

{
  ushort uVar1;
  uint uVar2;
  undefined1 uVar3;
  uint32 size;
  
  uVar1 = *(ushort *)&(this->super_BufferBuilder).field_0x14;
  if (uVar1 < 0xfe) {
    uVar2 = (this->super_BufferBuilder).offset;
    if (uVar2 == bufferSize) goto LAB_00883c27;
    buffer[uVar2] = (byte)uVar1;
    size = 1;
  }
  else {
    uVar2 = (this->super_BufferBuilder).offset;
    if ((short)uVar1 < 0xfe) {
      if (bufferSize - uVar2 < 3) goto LAB_00883c27;
      buffer[uVar2] = 0xff;
    }
    else {
      if (bufferSize - uVar2 < 3) {
LAB_00883c27:
        Throw::FatalInternalError(-0x7fffbffb);
      }
      buffer[uVar2] = 0xfe;
    }
    uVar3 = (this->super_BufferBuilder).field_0x15;
    uVar2 = (this->super_BufferBuilder).offset;
    (buffer + (ulong)uVar2 + 1)[0] = (this->super_BufferBuilder).field_0x14;
    (buffer + (ulong)uVar2 + 1)[1] = uVar3;
    size = 3;
  }
  BufferBuilder::TraceOutput(&this->super_BufferBuilder,buffer,size);
  return;
}

Assistant:

void Write(__in_bcount(bufferSize) byte * buffer, __in uint32 bufferSize) const
        {
            DebugOnly(uint32 size = sizeof(T));

#if INSTRUMENT_BUFFER_INTS
            if (value < ((1 << 8)))
            {
                Counts[0]++;
            }
            else if (value < ((1 << 16)))
            {
                Counts[1]++;
            }
            else if (value < ((1 << 24)))
            {
                Counts[2]++;
            }
            else
            {
                Counts[3]++;
            }
#endif

            if (useVariableIntEncoding)
            {
                if (UseOneByte())
                {
                    if (bufferSize - this->offset < sizeof(serialization_alignment byte))
                    {
                        Throw::FatalInternalError();
                    }
                    DebugOnly(size = sizeof(byte));
                    *(serialization_alignment byte*)(buffer + this->offset) = (byte) value;
                }
                else if (UseTwoBytes())
                {
                    if (bufferSize - this->offset < sizeof(serialization_alignment uint16) + sizeof(serialization_alignment byte))
                    {
                        Throw::FatalInternalError();
                    }
                    DebugOnly(size = sizeof(uint16) + 1);
                    *(serialization_alignment byte*)(buffer + this->offset) = TWO_BYTE_SENTINEL;
                    *(serialization_alignment uint16*)(buffer + this->offset + SENTINEL_BYTE_COUNT) = (uint16) this->value;
                }
                else
                {
                    if (bufferSize - this->offset < sizeof(serialization_alignment T) + sizeof(serialization_alignment byte))
                    {
                        Throw::FatalInternalError();
                    }
                    *(serialization_alignment byte*)(buffer + this->offset) = FOUR_BYTE_SENTINEL;
                    *(serialization_alignment T*)(buffer + this->offset + SENTINEL_BYTE_COUNT) = this->value;
                    DebugOnly(size = sizeof(T) + 1);
#if INSTRUMENT_BUFFER_INTS
                    Output::Print(_u("[BCGENSTATS] %d, %d\n"), value, sizeof(T));
#endif
                }
            }
            else
            {
                if (bufferSize - this->offset<sizeof(serialization_alignment T))
                {
                    Throw::FatalInternalError();
                }
                *(serialization_alignment T*)(buffer + this->offset) = value;
            }
            DebugOnly(TraceOutput(buffer, size));
        }